

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Qiniu_Error Qiniu_Client_config(Qiniu_Client *self)

{
  void *pvVar1;
  int iVar2;
  Qiniu_Error QVar3;
  CURL *curl;
  int retCode;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  self_local = (Qiniu_Client *)Qiniu_OK._0_8_;
  err._0_8_ = Qiniu_OK.message;
  pvVar1 = self->curl;
  if ((self->boundNic != (char *)0x0) &&
     (iVar2 = curl_easy_setopt(pvVar1,0x274e,self->boundNic), iVar2 != 0)) {
    self_local = (Qiniu_Client *)0x270a;
    err._0_8_ = anon_var_dwarf_8c78;
    goto LAB_00117e53;
  }
  if ((0 < self->lowSpeedLimit) && (0 < self->lowSpeedTime)) {
    iVar2 = curl_easy_setopt(pvVar1,0x13,self->lowSpeedLimit);
    if (iVar2 != 0) {
      self_local = (Qiniu_Client *)0x270a;
      err._0_8_ = anon_var_dwarf_8c96;
      goto LAB_00117e53;
    }
    iVar2 = curl_easy_setopt(pvVar1,0x14,self->lowSpeedTime);
    if (iVar2 != 0) {
      self_local = (Qiniu_Client *)0x270a;
      err._0_8_ = anon_var_dwarf_8cac;
      goto LAB_00117e53;
    }
  }
  if ((self->timeoutMs < 1) || (iVar2 = curl_easy_setopt(pvVar1,0x9b,self->timeoutMs), iVar2 == 0))
  {
    if ((0 < self->connectTimeoutMs) &&
       (iVar2 = curl_easy_setopt(pvVar1,0x9c,self->connectTimeoutMs), iVar2 != 0)) {
      self_local = (Qiniu_Client *)0x270a;
      err._0_8_ = anon_var_dwarf_8cd8;
    }
  }
  else {
    self_local = (Qiniu_Client *)0x270a;
    err._0_8_ = anon_var_dwarf_8cc2;
  }
LAB_00117e53:
  QVar3._0_8_ = (ulong)self_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_Client_config(Qiniu_Client *self)
{
    int retCode = 0;
    Qiniu_Error err = Qiniu_OK;
    CURL *curl = (CURL *)self->curl;

    // Bind the NIC for sending packets.
    if (self->boundNic != NULL)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_INTERFACE, self->boundNic);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not bind the given NIC";
            return err;
        }
    }

    // Specify the low speed limit and time
    if (self->lowSpeedLimit > 0 && self->lowSpeedTime > 0)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, self->lowSpeedLimit);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the low speed limit";
            return err;
        }
        retCode = curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, self->lowSpeedTime);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the low speed time";
            return err;
        }
    }

    // Specify the timeout
    if (self->timeoutMs > 0)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_TIMEOUT_MS, self->timeoutMs);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the timeout";
            return err;
        }
    }

    // Specify the connect timeout
    if (self->connectTimeoutMs > 0)
    {
        retCode = curl_easy_setopt(curl, CURLOPT_CONNECTTIMEOUT_MS, self->connectTimeoutMs);
        if (retCode != CURLE_OK)
        {
            err.code = 9994;
            err.message = "Can not specify the connect timeout";
            return err;
        }
    }

    return err;
}